

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::ReadNumBins(BamStandardIndex *this,int *numBins)

{
  undefined8 uVar1;
  int32_t *in_RSI;
  long in_RDI;
  int64_t numBytesRead;
  allocator local_71;
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  BamException *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  long local_18;
  int32_t *local_10;
  
  local_10 = in_RSI;
  local_18 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x28))(*(long **)(in_RDI + 0x58),in_RSI,4);
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(local_10);
  }
  if (local_18 != 4) {
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamStandardIndex::ReadNumBins",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"could not read BAI bin count",&local_71);
    BamException::BamException
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::ReadNumBins(int& numBins) {
    const int64_t numBytesRead = m_resources.Device->Read((char*)&numBins, sizeof(numBins));
    if ( m_isBigEndian ) SwapEndian_32(numBins);
    if ( numBytesRead != sizeof(numBins) )
        throw BamException("BamStandardIndex::ReadNumBins", "could not read BAI bin count");
}